

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dec_multi_test.c
# Opt level: O3

int multi_dec_advanced(MpiDecMultiCtx *data)

{
  RK_U32 RVar1;
  MpiDecTestCmd *pMVar2;
  MppCtx pvVar3;
  MppApi *pMVar4;
  MppFrame frame;
  MPP_RET MVar5;
  int iVar6;
  RK_S64 RVar7;
  char *pcVar8;
  MppTask task;
  FileBufSlot *slot;
  MppPacket packet;
  MppFrame frame_out;
  MppTask local_50;
  FileBufSlot *local_48;
  long local_40;
  long local_38;
  
  pMVar2 = data->cmd;
  pvVar3 = data->ctx;
  pMVar4 = data->mpi;
  local_40 = 0;
  frame = data->frame;
  local_50 = (MppTask)0x0;
  RVar1 = data->quiet;
  local_48 = (FileBufSlot *)0x0;
  MVar5 = reader_index_read(pMVar2->reader,0,&local_48);
  if (((MVar5 != MPP_OK) &&
      (_mpp_log_l(2,"mpi_dec_multi_test","Assertion %s failed at %s:%d\n",0,"ret == MPP_OK",
                  "multi_dec_advanced",0x100), (DAT_001142d3 & 0x10) != 0)) ||
     ((local_48 == (FileBufSlot *)0x0 &&
      (_mpp_log_l(2,"mpi_dec_multi_test","Assertion %s failed at %s:%d\n",0,"slot",
                  "multi_dec_advanced",0x101), (DAT_001142d3 & 0x10) != 0)))) goto LAB_001056d4;
  mpp_packet_init_with_buffer(&local_40,local_48->buf);
  if (local_48->eos != 0) {
    mpp_packet_set_eos(local_40);
  }
  MVar5 = (*pMVar4->poll)(pvVar3,MPP_PORT_INPUT,MPP_POLL_BLOCK);
  if (MVar5 != MPP_OK) {
    pcVar8 = "mpp input poll failed\n";
LAB_00105445:
    iVar6 = _mpp_log_l(2,"mpi_dec_multi_test",pcVar8,0);
    return iVar6;
  }
  MVar5 = (*pMVar4->dequeue)(pvVar3,MPP_PORT_INPUT,&local_50);
  if (MVar5 != MPP_OK) {
    pcVar8 = "mpp task input dequeue failed\n";
    goto LAB_00105445;
  }
  if ((local_50 == (MppTask)0x0) &&
     (_mpp_log_l(2,"mpi_dec_multi_test","Assertion %s failed at %s:%d\n",0,"task",
                 "multi_dec_advanced",0x115), (DAT_001142d3 & 0x10) != 0)) goto LAB_001056d4;
  mpp_task_meta_set_packet(local_50,0x69706b74,local_40);
  mpp_task_meta_set_frame(local_50,0x6f66726d,frame);
  MVar5 = (*pMVar4->enqueue)(pvVar3,MPP_PORT_INPUT,local_50);
  if (MVar5 != MPP_OK) {
    pcVar8 = "mpp task input enqueue failed\n";
    goto LAB_00105445;
  }
  if (data->first_pkt == 0) {
    RVar7 = mpp_time();
    data->first_pkt = RVar7;
  }
  MVar5 = (*pMVar4->poll)(pvVar3,MPP_PORT_OUTPUT,MPP_POLL_BLOCK);
  if (MVar5 != MPP_OK) {
    pcVar8 = "mpp output poll failed\n";
    goto LAB_00105445;
  }
  MVar5 = (*pMVar4->dequeue)(pvVar3,MPP_PORT_OUTPUT,&local_50);
  if (MVar5 != MPP_OK) {
    pcVar8 = "mpp task output dequeue failed\n";
    goto LAB_00105445;
  }
  if (local_50 == (MppTask)0x0) {
    _mpp_log_l(2,"mpi_dec_multi_test","Assertion %s failed at %s:%d\n",0,"task","multi_dec_advanced"
               ,0x130);
    if ((DAT_001142d3 & 0x10) != 0) goto LAB_001056d4;
    if (local_50 != (MppTask)0x0) goto LAB_001054bc;
  }
  else {
LAB_001054bc:
    local_38 = 0;
    mpp_task_meta_get_frame(local_50,0x6f66726d);
    if (frame != (MppFrame)0x0) {
      if (data->first_frm == 0) {
        RVar7 = mpp_time();
        data->first_frm = RVar7;
      }
      if (data->fp_output != (FILE *)0x0) {
        dump_mpp_frame_to_file(frame,data->fp_output);
      }
      if (RVar1 == 0) {
        _mpp_log_l(4,"mpi_dec_multi_test","%p decoded frame %d\n",0,pvVar3,data->frame_count);
      }
      data->frame_count = data->frame_count + 1;
      iVar6 = mpp_frame_get_eos(local_38);
      if ((RVar1 == 0) && (iVar6 != 0)) {
        _mpp_log_l(4,"mpi_dec_multi_test","%p found eos frame\n",0,pvVar3);
      }
      fps_calc_inc(pMVar2->fps);
    }
    iVar6 = data->frame_num;
    if (iVar6 < 1) {
      if ((iVar6 == 0) && (local_48->eos != 0)) goto LAB_00105583;
    }
    else if (iVar6 <= data->frame_count) {
LAB_00105583:
      data->loop_end = 1;
    }
    MVar5 = (*pMVar4->enqueue)(pvVar3,MPP_PORT_OUTPUT,local_50);
    if (MVar5 != MPP_OK) {
      _mpp_log_l(2,"mpi_dec_multi_test","mpp task output enqueue failed\n",0);
    }
  }
  MVar5 = (*pMVar4->dequeue)(pvVar3,MPP_PORT_INPUT,&local_50);
  if (MVar5 == MPP_OK) {
    if (local_50 == (MppTask)0x0) {
      _mpp_log_l(2,"mpi_dec_multi_test","Assertion %s failed at %s:%d\n",0,"task",
                 "multi_dec_advanced",0x163);
      if ((DAT_001142d3 & 0x10) != 0) {
LAB_001056d4:
        abort();
      }
      if (local_50 == (MppTask)0x0) {
        return 0x1142d0;
      }
    }
    local_38 = 0;
    mpp_task_meta_get_packet(local_50,0x69706b74,&local_38);
    if (local_38 == 0 || local_38 != local_40) {
      _mpp_log_l(2,"mpi_dec_multi_test","mismatch packet %p -> %p\n","multi_dec_advanced");
    }
    mpp_packet_deinit(&local_38);
    MVar5 = (*pMVar4->enqueue)(pvVar3,MPP_PORT_INPUT,local_50);
    if (MVar5 == MPP_OK) {
      return 0;
    }
    pcVar8 = "%p mpp task input enqueue failed\n";
  }
  else {
    pcVar8 = "%p mpp task input dequeue failed\n";
  }
  iVar6 = _mpp_log_l(2,"mpi_dec_multi_test",pcVar8,0,pvVar3);
  return iVar6;
}

Assistant:

static int multi_dec_advanced(MpiDecMultiCtx *data)
{
    MPP_RET ret = MPP_OK;
    MpiDecTestCmd *cmd = data->cmd;
    MppCtx ctx  = data->ctx;
    MppApi *mpi = data->mpi;
    MppPacket packet = NULL;
    MppFrame  frame  = data->frame;
    MppTask task = NULL;
    RK_U32 quiet = data->quiet;
    FileBufSlot *slot = NULL;

    ret = reader_index_read(cmd->reader, 0, &slot);
    mpp_assert(ret == MPP_OK);
    mpp_assert(slot);

    mpp_packet_init_with_buffer(&packet, slot->buf);

    // setup eos flag
    if (slot->eos)
        mpp_packet_set_eos(packet);

    ret = mpi->poll(ctx, MPP_PORT_INPUT, MPP_POLL_BLOCK);
    if (ret) {
        mpp_err("mpp input poll failed\n");
        return ret;
    }

    ret = mpi->dequeue(ctx, MPP_PORT_INPUT, &task);  /* input queue */
    if (ret) {
        mpp_err("mpp task input dequeue failed\n");
        return ret;
    }

    mpp_assert(task);

    mpp_task_meta_set_packet(task, KEY_INPUT_PACKET, packet);
    mpp_task_meta_set_frame (task, KEY_OUTPUT_FRAME,  frame);

    ret = mpi->enqueue(ctx, MPP_PORT_INPUT, task);  /* input queue */
    if (ret) {
        mpp_err("mpp task input enqueue failed\n");
        return ret;
    }

    if (!data->first_pkt)
        data->first_pkt = mpp_time();

    /* poll and wait here */
    ret = mpi->poll(ctx, MPP_PORT_OUTPUT, MPP_POLL_BLOCK);
    if (ret) {
        mpp_err("mpp output poll failed\n");
        return ret;
    }

    ret = mpi->dequeue(ctx, MPP_PORT_OUTPUT, &task); /* output queue */
    if (ret) {
        mpp_err("mpp task output dequeue failed\n");
        return ret;
    }

    mpp_assert(task);

    if (task) {
        MppFrame frame_out = NULL;

        mpp_task_meta_get_frame(task, KEY_OUTPUT_FRAME, &frame_out);

        if (frame) {
            if (!data->first_frm)
                data->first_frm = mpp_time();

            if (data->fp_output)
                dump_mpp_frame_to_file(frame, data->fp_output);

            mpp_log_q(quiet, "%p decoded frame %d\n", ctx, data->frame_count);
            data->frame_count++;

            if (mpp_frame_get_eos(frame_out)) {
                mpp_log_q(quiet, "%p found eos frame\n", ctx);
            }
            fps_calc_inc(cmd->fps);
        }

        if (data->frame_num > 0) {
            if (data->frame_count >= data->frame_num)
                data->loop_end = 1;
        } else if (data->frame_num == 0) {
            if (slot->eos)
                data->loop_end = 1;
        }

        /* output queue */
        ret = mpi->enqueue(ctx, MPP_PORT_OUTPUT, task);
        if (ret)
            mpp_err("mpp task output enqueue failed\n");
    }

    /*
     * The following input port task dequeue and enqueue is to make sure that
     * the input packet can be released. We can directly deinit the input packet
     * after frame output in most cases.
     */
    if (0) {
        mpp_packet_deinit(&packet);
    } else {
        ret = mpi->dequeue(ctx, MPP_PORT_INPUT, &task);  /* input queue */
        if (ret) {
            mpp_err("%p mpp task input dequeue failed\n", ctx);
            return ret;
        }

        mpp_assert(task);
        if (task) {
            MppPacket packet_out = NULL;

            mpp_task_meta_get_packet(task, KEY_INPUT_PACKET, &packet_out);

            if (!packet_out || packet_out != packet)
                mpp_err_f("mismatch packet %p -> %p\n", packet, packet_out);

            mpp_packet_deinit(&packet_out);

            /* input empty task back to mpp to maintain task status */
            ret = mpi->enqueue(ctx, MPP_PORT_INPUT, task);
            if (ret)
                mpp_err("%p mpp task input enqueue failed\n", ctx);
        }
    }

    return ret;
}